

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QMetaCallEvent::allocArgs(QMetaCallEvent *this)

{
  char *pcVar1;
  size_t __nmemb;
  
  __nmemb = (size_t)(this->d).nargs_;
  if (__nmemb != 0) {
    if (__nmemb << 4 < 0x31) {
      pcVar1 = this->prealloc_;
    }
    else {
      pcVar1 = (char *)calloc(__nmemb,0x10);
      if (pcVar1 == (char *)0x0) {
        qBadAlloc();
      }
    }
    (this->d).args_ = (void **)pcVar1;
  }
  return;
}

Assistant:

inline void QMetaCallEvent::allocArgs()
{
    if (!d.nargs_)
        return;

    constexpr size_t each = sizeof(void*) + sizeof(QMetaType);
    void *const memory = d.nargs_ * each > sizeof(prealloc_) ?
        calloc(d.nargs_, each) : prealloc_;

    Q_CHECK_PTR(memory);
    d.args_ = static_cast<void **>(memory);
}